

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_ImportCall
              (JavascriptFunction *function,Var specifier,ScriptContext *scriptContext)

{
  JavascriptLibrary *this;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  ModuleID moduleId;
  FunctionBody *this_00;
  JavascriptString *pJVar6;
  DWORD_PTR DVar7;
  Utf8SourceInfo *pUVar8;
  SourceContextInfo *pSVar9;
  undefined7 extraout_var;
  JavascriptFunction **ppFunc;
  undefined4 extraout_var_00;
  ScriptContext *pSVar10;
  SourceTextModuleRecord *pSVar11;
  size_t sVar12;
  Recycler *this_01;
  undefined4 extraout_var_01;
  undefined4 *puVar13;
  JavascriptError *pJVar14;
  Var pvVar15;
  long lVar16;
  PCWSTR message;
  size_t size;
  undefined1 local_100 [8];
  JavascriptStackWalker walker;
  void *local_50;
  ModuleRecordBase *moduleRecordBase;
  char16_t *local_40;
  JavascriptFunction *local_38;
  JavascriptFunction *caller;
  
  local_50 = (void *)0x0;
  this_00 = JavascriptFunction::GetFunctionBody(function);
  pJVar6 = JavascriptConversion::ToString(specifier,scriptContext);
  DVar7 = FunctionProxy::GetHostSourceContext((FunctionProxy *)this_00);
  bVar3 = ParseableFunctionInfo::IsES6ModuleCode(&this_00->super_ParseableFunctionInfo);
  if (DVar7 == 0xffffffffffffffff && !bVar3) {
    pUVar8 = Utf8SourceInfo::GetCallerUtf8SourceInfo
                       ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                        ptr);
    if (pUVar8 == (Utf8SourceInfo *)0x0) {
      pJVar14 = JavascriptLibrary::CreateError
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      JavascriptError::SetErrorMessageProperties
                (pJVar14,-0x7fffbffb,L"Unable to locate active script or module that calls import()"
                 ,scriptContext);
      pvVar15 = SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                          (false,pJVar14,scriptContext,(SourceTextModuleRecord *)0x0,true);
      return pvVar15;
    }
    pUVar8 = Utf8SourceInfo::GetCallerUtf8SourceInfo
                       ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                        ptr);
    pSVar9 = Utf8SourceInfo::GetSourceContextInfo(pUVar8);
    DVar7 = pSVar9->dwHostSourceContext;
    if (DVar7 == 0xffffffffffffffff) {
      local_38 = (JavascriptFunction *)0x0;
      JavascriptStackWalker::JavascriptStackWalker
                ((JavascriptStackWalker *)local_100,scriptContext,true,(PVOID)0x0,false);
      JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_100,&local_38,true);
      DVar7 = 0xffffffffffffffff;
      ppFunc = &local_38;
      do {
        BVar4 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_100,ppFunc,true);
        if (((BVar4 == 0) || (local_38 == (JavascriptFunction *)0x0)) ||
           (BVar4 = JavascriptFunction::IsScriptFunction(local_38), BVar4 == 0)) {
          pJVar14 = JavascriptLibrary::CreateError
                              ((scriptContext->super_ScriptContextBase).javascriptLibrary);
          JavascriptError::SetErrorMessageProperties
                    (pJVar14,-0x7fffbffb,
                     L"Unable to locate active script or module that calls import()",scriptContext);
          local_40 = (char16_t *)0x0;
          ppFunc = (JavascriptFunction **)
                   SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                             (false,pJVar14,scriptContext,(SourceTextModuleRecord *)0x0,true);
          goto LAB_00acbfc9;
        }
        this_00 = JavascriptFunction::GetFunctionBody(local_38);
        DVar7 = FunctionProxy::GetHostSourceContext((FunctionProxy *)this_00);
        bVar3 = ParseableFunctionInfo::IsES6ModuleCode(&this_00->super_ParseableFunctionInfo);
      } while (DVar7 == 0xffffffffffffffff && !bVar3);
      local_40 = (char16_t *)CONCAT71(extraout_var,1);
LAB_00acbfc9:
      JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_100);
      if ((char)local_40 == '\0') {
        return ppFunc;
      }
    }
  }
  iVar5 = (*(pJVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar6);
  local_40 = (char16_t *)CONCAT44(extraout_var_00,iVar5);
  bVar3 = ParseableFunctionInfo::IsES6ModuleCode(&this_00->super_ParseableFunctionInfo);
  if (bVar3) {
    pSVar10 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    this = (pSVar10->super_ScriptContextBase).javascriptLibrary;
    moduleId = FunctionBody::GetModuleID(this_00);
    pSVar11 = JavascriptLibrary::GetModuleRecord(this,moduleId);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_100,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar1 = scriptContext->threadContext;
    bVar3 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    AutoHandledExceptionType::AutoHandledExceptionType
              ((AutoHandledExceptionType *)&local_38,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    iVar5 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x12])
                      (scriptContext->hostScriptContext,pSVar11,local_40,&local_50);
    AutoHandledExceptionType::~AutoHandledExceptionType((AutoHandledExceptionType *)&local_38);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar1->reentrancySafeOrHandled = bVar3;
  }
  else {
    if (DVar7 == 0xffffffffffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x284d,
                                  "(dwReferencingSourceContext != Js::Constants::NoHostSourceContext)"
                                  ,
                                  "dwReferencingSourceContext != Js::Constants::NoHostSourceContext"
                                 );
      if (!bVar3) goto LAB_00acc6ff;
      *puVar13 = 0;
    }
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_100,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar1 = scriptContext->threadContext;
    bVar3 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    AutoHandledExceptionType::AutoHandledExceptionType
              ((AutoHandledExceptionType *)&local_38,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    iVar5 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x13])
                      (scriptContext->hostScriptContext,DVar7,local_40,&local_50);
    AutoHandledExceptionType::~AutoHandledExceptionType((AutoHandledExceptionType *)&local_38);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar1->reentrancySafeOrHandled = bVar3;
  }
  LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)local_100);
  if (iVar5 < 0) {
    walker.currentFrame.stackCheckCodeHeight._4_4_ = iVar5;
    sVar12 = PAL_wcslen(local_40);
    walker.entryExitRecord = (ScriptEntryExitRecord *)(sVar12 + 1);
    local_100 = (undefined1  [8])&char16_t::typeinfo;
    walker.scriptContext = (ScriptContext *)0x0;
    walker.nativeLibraryEntry = (Entry *)anon_var_dwarf_4e9d853;
    walker.prevNativeLibraryEntry._0_4_ = 0x2859;
    this_01 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_100);
    lVar16 = sVar12 + 1;
    if (lVar16 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_01,(TrackAllocData *)0x0);
      message = (PCWSTR)&DAT_00000008;
    }
    else {
      size = 0xffffffffffffffff;
      if (-1 < lVar16) {
        size = lVar16 * 2;
      }
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        moduleRecordBase = (ModuleRecordBase *)__tls_get_addr(&PTR_0155fe48);
        *(undefined4 *)
         &(moduleRecordBase->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00acc6ff;
        *(undefined4 *)
         &(moduleRecordBase->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject = 0;
      }
      if (size == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        moduleRecordBase = (ModuleRecordBase *)__tls_get_addr(&PTR_0155fe48);
        *(undefined4 *)
         &(moduleRecordBase->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                    "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
        if (!bVar3) goto LAB_00acc6ff;
        *(undefined4 *)
         &(moduleRecordBase->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject = 0;
      }
      message = (PCWSTR)Memory::Recycler::
                        AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(this_01,size);
      if (message == (PCWSTR)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_00acc6ff:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar13 = 0;
      }
    }
    memcpy_s(message,lVar16 * 2,local_40,sVar12 * 2);
    message[sVar12] = L'\0';
    pJVar14 = JavascriptLibrary::CreateURIError
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    JavascriptError::SetErrorMessageProperties
              (pJVar14,walker.currentFrame.stackCheckCodeHeight._4_4_,message,scriptContext);
    bVar3 = false;
    pSVar11 = (SourceTextModuleRecord *)0x0;
  }
  else {
    pSVar11 = SourceTextModuleRecord::FromHost(local_50);
    pJVar14 = (JavascriptError *)(pSVar11->errorObject).ptr;
    if (pJVar14 == (JavascriptError *)0x0) {
      if ((pSVar11->super_ModuleRecordBase).wasEvaluated != true) {
        pvVar15 = SourceTextModuleRecord::PostProcessDynamicModuleImport(pSVar11);
        return pvVar15;
      }
      iVar5 = (*(pSVar11->super_ModuleRecordBase).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6])(pSVar11);
      pJVar14 = (JavascriptError *)CONCAT44(extraout_var_01,iVar5);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  pvVar15 = SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                      (bVar3,pJVar14,scriptContext,pSVar11,true);
  return pvVar15;
}

Assistant:

Var JavascriptOperators::OP_ImportCall(__in JavascriptFunction *function, __in Var specifier, __in ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(ImportCall);
        ModuleRecordBase *moduleRecordBase = nullptr;
        SourceTextModuleRecord *moduleRecord = nullptr;

        FunctionBody* parentFuncBody = function->GetFunctionBody();
        JavascriptString *specifierString = nullptr;

        try
        {
            specifierString = JavascriptConversion::ToString(specifier, scriptContext);
        }
        catch (const JavascriptException &err)
        {
            Var errorObject = err.GetAndClear()->GetThrownObject(scriptContext);
            AssertMsg(errorObject != nullptr, "OP_ImportCall: null error object thrown by ToString(specifier)");
            if (errorObject != nullptr)
            {
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, errorObject, scriptContext);
            }

            Throw::InternalError();
        }

        DWORD_PTR dwReferencingSourceContext = parentFuncBody->GetHostSourceContext();
        if (!parentFuncBody->IsES6ModuleCode() && dwReferencingSourceContext == Js::Constants::NoHostSourceContext)
        {
            // import() called from eval
            if (parentFuncBody->GetUtf8SourceInfo()->GetCallerUtf8SourceInfo() == nullptr)
            {
                JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                JavascriptError::SetErrorMessageProperties(error, E_FAIL, _u("Unable to locate active script or module that calls import()"), scriptContext);
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
            }

            dwReferencingSourceContext = parentFuncBody->GetUtf8SourceInfo()->GetCallerUtf8SourceInfo()->GetSourceContextInfo()->dwHostSourceContext;

            if (dwReferencingSourceContext == Js::Constants::NoHostSourceContext)
            {
                // Walk the call stack if caller function is neither module code nor having host source context

                JavascriptFunction* caller = nullptr;
                Js::JavascriptStackWalker walker(scriptContext);
                walker.GetCaller(&caller);

                do
                {
                    if (walker.GetCaller(&caller) && caller != nullptr && caller->IsScriptFunction())
                    {
                        parentFuncBody = caller->GetFunctionBody();
                        dwReferencingSourceContext = parentFuncBody->GetHostSourceContext();
                    }
                    else
                    {
                        JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                        JavascriptError::SetErrorMessageProperties(error, E_FAIL, _u("Unable to locate active script or module that calls import()"), scriptContext);
                        return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
                    }

                } while (!parentFuncBody->IsES6ModuleCode() && dwReferencingSourceContext == Js::Constants::NoHostSourceContext);
            }
        }

        LPCOLESTR moduleName = specifierString->GetSz();
        HRESULT hr = 0;

        if (parentFuncBody->IsES6ModuleCode())
        {
            SourceTextModuleRecord *referenceModuleRecord = parentFuncBody->GetScriptContext()->GetLibrary()->GetModuleRecord(parentFuncBody->GetModuleID());
            BEGIN_LEAVE_SCRIPT(scriptContext);
            BEGIN_TRANSLATE_TO_HRESULT(static_cast<ExceptionType>(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            hr = scriptContext->GetHostScriptContext()->FetchImportedModule(referenceModuleRecord, moduleName, &moduleRecordBase);
            END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
            END_LEAVE_SCRIPT(scriptContext);
        }
        else
        {
            Assert(dwReferencingSourceContext != Js::Constants::NoHostSourceContext);
            BEGIN_LEAVE_SCRIPT(scriptContext);
            BEGIN_TRANSLATE_TO_HRESULT(static_cast<ExceptionType>(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            hr = scriptContext->GetHostScriptContext()->FetchImportedModuleFromScript(dwReferencingSourceContext, moduleName, &moduleRecordBase);
            END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
            END_LEAVE_SCRIPT(scriptContext);
        }

        if (FAILED(hr))
        {
            // We cannot just use the buffer in the specifier string - need to make a copy here.
            size_t length = wcslen(moduleName);
            char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
            wmemcpy_s(allocatedString, length + 1, moduleName, length);
            allocatedString[length] = _u('\0');

            Js::JavascriptError *error = scriptContext->GetLibrary()->CreateURIError();
            JavascriptError::SetErrorMessageProperties(error, hr, allocatedString, scriptContext);
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
        }

        moduleRecord = SourceTextModuleRecord::FromHost(moduleRecordBase);

        if (moduleRecord->GetErrorObject() != nullptr)
        {
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, moduleRecord->GetErrorObject(), scriptContext, moduleRecord);
        }
        else if (moduleRecord->WasEvaluated())
        {
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(true, moduleRecord->GetNamespace(), scriptContext, moduleRecord);
        }

        return moduleRecord->PostProcessDynamicModuleImport();
        JIT_HELPER_END(ImportCall);
    }